

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_daxpy_oe(int n,double alpha,double *x,int incx,double *y,int incy,double *z,int incz)

{
  uint __line;
  char *__assertion;
  ulong uVar1;
  bool bVar2;
  
  if (x == (double *)0x0) {
    __assertion = "x";
    __line = 0x4f;
  }
  else if (y == (double *)0x0) {
    __assertion = "y";
    __line = 0x50;
  }
  else {
    if (z != (double *)0x0) {
      uVar1 = 0;
      if (0 < n) {
        uVar1 = (ulong)(uint)n;
      }
      while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
        *z = *x * alpha + *y;
        x = x + incx;
        y = y + incy;
        z = z + incz;
      }
      return;
    }
    __assertion = "z";
    __line = 0x51;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,__line,
                "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_daxpy_oe(
        int n,
        double alpha,
        const double *x, int incx,
        const double *y, int incy,
        double *z, int incz)
{
    assert(x);
    assert(y);
    assert(z);

    for (int i = 0; i < n; i++) {
        z[i * incz] = alpha * x[i * incx] + y[i * incy];
    }
}